

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O2

UnicodeString * __thiscall
icu_63::UnicodeString::setTo(UnicodeString *this,UnicodeString *srcText,int32_t srcStart)

{
  short sVar1;
  UnicodeString *pUVar2;
  int32_t length;
  int32_t iVar3;
  int32_t local_1c;
  
  local_1c = srcStart;
  unBogus(this);
  pinIndex(srcText,&local_1c);
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    length = (this->fUnion).fFields.fLength;
  }
  else {
    length = (int)sVar1 >> 5;
  }
  sVar1 = (srcText->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (srcText->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  pUVar2 = doReplace(this,0,length,srcText,local_1c,iVar3 - local_1c);
  return pUVar2;
}

Assistant:

inline UnicodeString&
UnicodeString::setTo(const UnicodeString& srcText,
             int32_t srcStart)
{
  unBogus();
  srcText.pinIndex(srcStart);
  return doReplace(0, length(), srcText, srcStart, srcText.length() - srcStart);
}